

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::matrix4d>(Attribute *this,matrix4d *v)

{
  value_type *__src;
  optional<tinyusdz::value::matrix4d> local_130;
  undefined1 local_a8 [8];
  optional<tinyusdz::value::matrix4d> ret;
  matrix4d *v_local;
  Attribute *this_local;
  
  if (v == (matrix4d *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained._120_8_ = v;
    primvar::PrimVar::get_value<tinyusdz::value::matrix4d>(&local_130,&this->_var);
    nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::
    optional<tinyusdz::value::matrix4d,_0>
              ((optional<tinyusdz::value::matrix4d> *)local_a8,&local_130);
    nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional(&local_130);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_a8);
    if (this_local._7_1_) {
      __src = nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::value
                        ((optional<tinyusdz::value::matrix4d> *)local_a8);
      memcpy((void *)ret.contained._120_8_,__src,0x80);
    }
    nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional
              ((optional<tinyusdz::value::matrix4d> *)local_a8);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }